

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

void calc_param_inertia2ff(void)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double T;
  double Rl;
  double Rr;
  double Jtl;
  double Jtr;
  double Jml;
  double Jmr;
  double Gl;
  double Gr;
  double J;
  double M;
  double D;
  double C;
  double B;
  double A;
  int i;
  
  dVar2 = ABS(g_P[9][0]);
  dVar3 = ABS(g_P[9][1]);
  g_P[0x30][0] = (((g_P[0xf][0] * g_P[0xf][0]) / 2.0) *
                  (g_P[0x28][0] / 2.0 + g_P[0x29][0] / (g_P[0x12][0] * g_P[0x12][0])) +
                 dVar2 * dVar2 * g_P[0x2a][0] + g_P[0x2b][0]) / dVar2;
  g_P[0x31][0] = (((g_P[0xf][1] * g_P[0xf][1]) / 2.0) *
                  (g_P[0x28][0] / 2.0 + g_P[0x29][0] / (g_P[0x12][0] * g_P[0x12][0])) +
                 dVar3 * dVar3 * g_P[0x2a][1] + g_P[0x2b][1]) / dVar3;
  g_P[0x32][0] = (((g_P[0xf][0] * g_P[0xf][1]) / 2.0) *
                 (g_P[0x28][0] / 2.0 - g_P[0x29][0] / (g_P[0x12][0] * g_P[0x12][0]))) / dVar2;
  g_P[0x33][0] = (((g_P[0xf][0] * g_P[0xf][1]) / 2.0) *
                 (g_P[0x28][0] / 2.0 - g_P[0x29][0] / (g_P[0x12][0] * g_P[0x12][0]))) / dVar3;
  g_P[0x3d][0] = g_P[0x30][0];
  g_P[0x3d][1] = g_P[0x31][0];
  g_P[0x3e][0] = g_P[0x32][0];
  g_P[0x3e][1] = g_P[0x33][0];
  iVar1 = ischanged_p(YP_PARAM_MASS,MOTOR_RIGHT);
  if (((((((iVar1 != 0) || (iVar1 = ischanged_p(YP_PARAM_MOMENT_INERTIA,MOTOR_RIGHT), iVar1 != 0))
         || (iVar1 = ischanged_p(YP_PARAM_GEAR,MOTOR_RIGHT), iVar1 != 0)) ||
        ((iVar1 = ischanged_p(YP_PARAM_GEAR,MOTOR_LEFT), iVar1 != 0 ||
         (iVar1 = ischanged_p(YP_PARAM_MOTOR_M_INERTIA,MOTOR_RIGHT), iVar1 != 0)))) ||
       ((iVar1 = ischanged_p(YP_PARAM_MOTOR_M_INERTIA,MOTOR_LEFT), iVar1 != 0 ||
        ((iVar1 = ischanged_p(YP_PARAM_TIRE_M_INERTIA,MOTOR_RIGHT), iVar1 != 0 ||
         (iVar1 = ischanged_p(YP_PARAM_TIRE_M_INERTIA,MOTOR_LEFT), iVar1 != 0)))))) ||
      (iVar1 = ischanged_p(YP_PARAM_RADIUS,MOTOR_RIGHT), iVar1 != 0)) ||
     ((iVar1 = ischanged_p(YP_PARAM_RADIUS,MOTOR_LEFT), iVar1 != 0 ||
      (iVar1 = ischanged_p(YP_PARAM_TREAD,MOTOR_RIGHT), iVar1 != 0)))) {
    g_P_changed[0x30][0] = 1;
    g_P_changed[0x31][0] = 1;
    g_P_changed[0x32][0] = 1;
    g_P_changed[0x33][0] = 1;
    g_P_changed[0x3d][0] = 1;
    g_P_changed[0x3e][0] = 1;
    g_P_changed[0x3d][1] = 1;
    g_P_changed[0x3e][1] = 1;
  }
  for (A._4_4_ = MOTOR_RIGHT; (int)A._4_4_ < 0x10; A._4_4_ = A._4_4_ + MOTOR_LEFT) {
    if ((g_param.motor_enable[(int)A._4_4_] != 0) &&
       (dVar2 = p(YP_PARAM_VEHICLE_CONTROL,A._4_4_), dVar2 <= 0.0)) {
      g_P[0x3d][(int)A._4_4_] =
           ABS(g_P[9][(int)A._4_4_]) * g_P[0x2a][(int)A._4_4_] +
           g_P[0x2b][(int)A._4_4_] / ABS(g_P[9][(int)A._4_4_]);
      g_P[0x3e][(int)A._4_4_] = 0.0;
      iVar1 = ischanged_p(YP_PARAM_GEAR,A._4_4_);
      if ((iVar1 != 0) ||
         ((iVar1 = ischanged_p(YP_PARAM_MOTOR_M_INERTIA,A._4_4_), iVar1 != 0 ||
          (iVar1 = ischanged_p(YP_PARAM_TIRE_M_INERTIA,A._4_4_), iVar1 != 0)))) {
        g_P_changed[0x3d][(int)A._4_4_] = 1;
        g_P_changed[0x3e][(int)A._4_4_] = 1;
      }
    }
  }
  for (A._4_4_ = 0; (int)A._4_4_ < 0x10; A._4_4_ = A._4_4_ + 1) {
    if (g_param.motor_enable[(int)A._4_4_] != 0) {
      yprintf(OUTPUT_LV_DEBUG," LOAD_INERTIA_SELF[%d]  %f\n",g_P[0x3d][(int)A._4_4_],(ulong)A._4_4_)
      ;
      yprintf(OUTPUT_LV_DEBUG," LOAD_INERTIA_CROSS[%d] %f\n",g_P[0x3e][(int)A._4_4_],(ulong)A._4_4_)
      ;
    }
  }
  return;
}

Assistant:

void calc_param_inertia2ff(void)
{
  int i;
  double A, B, C, D;  // 制御パラメータ
  double M, J;        // ロボットの質量、慣性モーメント
  double Gr, Gl;      // ギア比
  double Jmr, Jml;    // モータの慣性モーメント
  double Jtr, Jtl;    // タイヤの慣性モーメント
  double Rr, Rl;      // タイヤ半径
  double T;           // トレッド

  // パラメータの代入
  M = g_P[YP_PARAM_MASS][0];
  J = g_P[YP_PARAM_MOMENT_INERTIA][0];
  Gr = fabs(g_P[YP_PARAM_GEAR][0]);
  Gl = fabs(g_P[YP_PARAM_GEAR][1]);
  Jmr = g_P[YP_PARAM_MOTOR_M_INERTIA][0];
  Jml = g_P[YP_PARAM_MOTOR_M_INERTIA][1];
  Jtr = g_P[YP_PARAM_TIRE_M_INERTIA][0];
  Jtl = g_P[YP_PARAM_TIRE_M_INERTIA][1];
  Rr = g_P[YP_PARAM_RADIUS][0];
  Rl = g_P[YP_PARAM_RADIUS][1];
  T = g_P[YP_PARAM_TREAD][0];

  // パラメータの計算
  A = (Gr * Gr * Jmr + Jtr + Rr * Rr / 2.0 * (M / 2.0 + J / (T * T))) / Gr;
  B = (Gl * Gl * Jml + Jtl + Rl * Rl / 2.0 * (M / 2.0 + J / (T * T))) / Gl;
  C = (Rr * Rl / 2.0 * (M / 2.0 - J / (T * T))) / Gr;
  D = (Rr * Rl / 2.0 * (M / 2.0 - J / (T * T))) / Gl;

  // パラメータの設定
  g_P[YP_PARAM_GAIN_A][0] = A;
  g_P[YP_PARAM_GAIN_B][0] = B;
  g_P[YP_PARAM_GAIN_C][0] = C;
  g_P[YP_PARAM_GAIN_D][0] = D;

  g_P[YP_PARAM_INERTIA_SELF][0] = A;
  g_P[YP_PARAM_INERTIA_SELF][1] = B;
  g_P[YP_PARAM_INERTIA_CROSS][0] = C;
  g_P[YP_PARAM_INERTIA_CROSS][1] = D;

  if (ischanged_p(YP_PARAM_MASS, 0) ||
      ischanged_p(YP_PARAM_MOMENT_INERTIA, 0) ||
      ischanged_p(YP_PARAM_GEAR, 0) ||
      ischanged_p(YP_PARAM_GEAR, 1) ||
      ischanged_p(YP_PARAM_MOTOR_M_INERTIA, 0) ||
      ischanged_p(YP_PARAM_MOTOR_M_INERTIA, 1) ||
      ischanged_p(YP_PARAM_TIRE_M_INERTIA, 0) ||
      ischanged_p(YP_PARAM_TIRE_M_INERTIA, 1) ||
      ischanged_p(YP_PARAM_RADIUS, 0) ||
      ischanged_p(YP_PARAM_RADIUS, 1) ||
      ischanged_p(YP_PARAM_TREAD, 0))
  {
    g_P_changed[YP_PARAM_GAIN_A][0] = 1;
    g_P_changed[YP_PARAM_GAIN_B][0] = 1;
    g_P_changed[YP_PARAM_GAIN_C][0] = 1;
    g_P_changed[YP_PARAM_GAIN_D][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_SELF][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_CROSS][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_SELF][1] = 1;
    g_P_changed[YP_PARAM_INERTIA_CROSS][1] = 1;
  }
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!g_param.motor_enable[i])
      continue;
    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
      continue;

    g_P[YP_PARAM_INERTIA_SELF][i] =
        fabs(g_P[YP_PARAM_GEAR][i]) * g_P[YP_PARAM_MOTOR_M_INERTIA][i] + g_P[YP_PARAM_TIRE_M_INERTIA][i] / fabs(g_P[YP_PARAM_GEAR][i]);
    g_P[YP_PARAM_INERTIA_CROSS][i] = 0;

    if (ischanged_p(YP_PARAM_GEAR, i) ||
        ischanged_p(YP_PARAM_MOTOR_M_INERTIA, i) ||
        ischanged_p(YP_PARAM_TIRE_M_INERTIA, i))
    {
      g_P_changed[YP_PARAM_INERTIA_SELF][i] = 1;
      g_P_changed[YP_PARAM_INERTIA_CROSS][i] = 1;
    }
  }
  // 出力（デバッグ）
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!g_param.motor_enable[i])
      continue;

    yprintf(OUTPUT_LV_DEBUG, " LOAD_INERTIA_SELF[%d]  %f\n", i, g_P[YP_PARAM_INERTIA_SELF][i]);
    yprintf(OUTPUT_LV_DEBUG, " LOAD_INERTIA_CROSS[%d] %f\n", i, g_P[YP_PARAM_INERTIA_CROSS][i]);
  }
}